

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O2

int gpu_default_print(GPU_LogLevelEnum log_level,char *format,__va_list_tag *args)

{
  int iVar1;
  undefined8 *puVar2;
  
  if (log_level == GPU_LOG_INFO) {
    if (_gpu_debug_level < GPU_DEBUG_LEVEL_3) {
LAB_00136137:
      puVar2 = (undefined8 *)&stdout;
      goto LAB_0013613e;
    }
  }
  else if (log_level == GPU_LOG_WARNING) {
    if (_gpu_debug_level < GPU_DEBUG_LEVEL_2) goto LAB_00136137;
  }
  else if (log_level != GPU_LOG_ERROR) {
    return 0;
  }
  puVar2 = (undefined8 *)&stderr;
LAB_0013613e:
  iVar1 = vfprintf((FILE *)*puVar2,format,args);
  return iVar1;
}

Assistant:

int gpu_default_print(GPU_LogLevelEnum log_level, const char* format, va_list args)
{
    switch(log_level)
    {
#ifdef __ANDROID__
    case GPU_LOG_INFO:
        return __android_log_vprint((GPU_GetDebugLevel() >= GPU_DEBUG_LEVEL_3? ANDROID_LOG_ERROR : ANDROID_LOG_INFO), "APPLICATION", format, args);
    case GPU_LOG_WARNING:
        return __android_log_vprint((GPU_GetDebugLevel() >= GPU_DEBUG_LEVEL_2? ANDROID_LOG_ERROR : ANDROID_LOG_WARN), "APPLICATION", format, args);
    case GPU_LOG_ERROR:
        return __android_log_vprint(ANDROID_LOG_ERROR, "APPLICATION", format, args);
#else
    case GPU_LOG_INFO:
        return vfprintf((GPU_GetDebugLevel() >= GPU_DEBUG_LEVEL_3? stderr : stdout), format, args);
    case GPU_LOG_WARNING:
        return vfprintf((GPU_GetDebugLevel() >= GPU_DEBUG_LEVEL_2? stderr : stdout), format, args);
    case GPU_LOG_ERROR:
        return vfprintf(stderr, format, args);
#endif
    default:
        return 0;
    }
}